

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

String * asl::Url::decode(String *__return_storage_ptr__,String *q0)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  char c;
  int local_20;
  char local_1c;
  char local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  int i;
  char b [3];
  String *q0_local;
  String *q;
  
  local_19 = 0;
  _i = q0;
  asl::String::String(__return_storage_ptr__);
  local_1a = 0;
  local_20 = 0;
  do {
    iVar1 = asl::String::length(_i);
    if (iVar1 <= local_20) {
      return __return_storage_ptr__;
    }
    pcVar2 = asl::String::operator[](_i,local_20);
    if (*pcVar2 == '%') {
      iVar1 = asl::String::length(_i);
      if (iVar1 + -2 < local_20) {
        return __return_storage_ptr__;
      }
      pcVar2 = asl::String::operator[](_i,local_20 + 1);
      local_1c = *pcVar2;
      pcVar2 = asl::String::operator[](_i,local_20 + 2);
      local_1b = *pcVar2;
      uVar3 = strtoul(&local_1c,(char **)0x0,0x10);
      asl::String::operator<<(__return_storage_ptr__,(char)uVar3);
      local_20 = local_20 + 2;
    }
    else {
      asl::String::operator<<(__return_storage_ptr__,*pcVar2);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

String Url::decode(const String& q0)
{
	String q;
	char   b[3];
	b[2] = '\0';
	for (int i = 0; i < q0.length(); i++)
	{
		char c = q0[i];
		if (c == '%')
		{
			if (i > q0.length() - 2)
				break;
			b[0] = q0[i + 1];
			b[1] = q0[i + 2];
			q << (char)strtoul(b, NULL, 16);
			i += 2;
		}
		else
		q << c;
	}
#ifdef ASL_ANSI
	return utf8ToLocal(q);
#else
	return q;
#endif
}